

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::Program::setAttribute
          (Program *this,Buffer *attrBuf,int attrBufOffset,VarSpec *attrSpec,
          string *shaderNameManglingSuffix)

{
  bool bVar1;
  GLuint GVar2;
  int size;
  GLchar *name;
  socklen_t __len;
  sockaddr *__addr;
  string local_58;
  GLuint local_34;
  string *psStack_30;
  int attrLoc;
  string *shaderNameManglingSuffix_local;
  VarSpec *attrSpec_local;
  Buffer *pBStack_18;
  int attrBufOffset_local;
  Buffer *attrBuf_local;
  Program *this_local;
  
  GVar2 = this->m_programGL;
  psStack_30 = shaderNameManglingSuffix;
  shaderNameManglingSuffix_local = &attrSpec->name;
  attrSpec_local._4_4_ = attrBufOffset;
  pBStack_18 = attrBuf;
  attrBuf_local = (Buffer *)this;
  mangleShaderNames(&local_58,&attrSpec->name,shaderNameManglingSuffix);
  __len = (socklen_t)attrSpec;
  name = (GLchar *)std::__cxx11::string::c_str();
  GVar2 = glwGetAttribLocation(GVar2,name);
  std::__cxx11::string::~string((string *)&local_58);
  local_34 = GVar2;
  glwEnableVertexAttribArray(GVar2);
  LongStressCaseInternal::Buffer::bind(pBStack_18,0x8892,__addr,__len);
  bVar1 = glu::isDataTypeFloatOrVec(*(DataType *)(shaderNameManglingSuffix_local + 1));
  GVar2 = local_34;
  if (bVar1) {
    size = glu::getDataTypeScalarSize(*(DataType *)(shaderNameManglingSuffix_local + 1));
    glwVertexAttribPointer(GVar2,size,0x1406,'\0',0,(void *)(long)attrSpec_local._4_4_);
  }
  return;
}

Assistant:

void Program::setAttribute (const Buffer& attrBuf, const int attrBufOffset, const VarSpec& attrSpec, const string& shaderNameManglingSuffix) const
{
	const int attrLoc = glGetAttribLocation(m_programGL, mangleShaderNames(attrSpec.name, shaderNameManglingSuffix).c_str());

	glEnableVertexAttribArray(attrLoc);
	attrBuf.bind(GL_ARRAY_BUFFER);

	if (glu::isDataTypeFloatOrVec(attrSpec.type))
		glVertexAttribPointer(attrLoc, glu::getDataTypeScalarSize(attrSpec.type), GL_FLOAT, GL_FALSE, 0, (GLvoid*)(deIntptr)attrBufOffset);
	else
		DE_ASSERT(false);
}